

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> * __thiscall
Catch::createShard<std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>
          (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           *__return_storage_ptr__,Catch *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *container,
          size_t shardCount,size_t shardIndex)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  long lVar3;
  unsigned_long *puVar4;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  _Var5;
  long lVar6;
  allocator<Catch::TestCaseHandle> local_89;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_88;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_80;
  TestCaseHandle *local_78;
  TestCaseHandle *local_70;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  endIterator;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  startIterator;
  size_t endIndex;
  size_t startIndex;
  size_t leftoverTests;
  size_t shardSize;
  size_t totalTestCount;
  size_t shardIndex_local;
  size_t shardCount_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *container_local;
  
  totalTestCount = shardCount;
  shardIndex_local = (size_t)container;
  shardCount_local = (size_t)this;
  container_local = __return_storage_ptr__;
  if (shardCount < container) {
    if (container == (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)0x1) {
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
                (__return_storage_ptr__,
                 (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)this);
    }
    else {
      shardSize = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                            ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                              *)this);
      leftoverTests = shardSize / shardIndex_local;
      startIndex = shardSize % shardIndex_local;
      lVar3 = totalTestCount * leftoverTests;
      puVar4 = std::min<unsigned_long>(&totalTestCount,&startIndex);
      uVar1 = *puVar4;
      startIterator._M_current = (TestCaseHandle *)(totalTestCount + 1);
      lVar6 = (long)startIterator._M_current * leftoverTests;
      puVar4 = std::min<unsigned_long>((unsigned_long *)&startIterator,&startIndex);
      uVar2 = *puVar4;
      endIterator._M_current =
           (TestCaseHandle *)
           std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                     ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                      shardCount_local);
      _Var5 = std::
              next<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>>
                        (endIterator,lVar3 + uVar1);
      local_78 = (TestCaseHandle *)
                 std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                           ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
                            )shardCount_local);
      local_88 = std::
                 next<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>>
                           ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                             )local_78,lVar6 + uVar2);
      local_80 = _Var5;
      local_70 = local_88._M_current;
      std::allocator<Catch::TestCaseHandle>::allocator(&local_89);
      std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
      vector<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,void>
                ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)
                 __return_storage_ptr__,local_80,local_88,&local_89);
      std::allocator<Catch::TestCaseHandle>::~allocator(&local_89);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("shardCount > shardIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x26ba,
                "Container Catch::createShard(const Container &, const std::size_t, const std::size_t) [Container = std::vector<Catch::TestCaseHandle>]"
               );
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }